

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scaler.pb.cc
# Opt level: O2

void __thiscall
CoreML::Specification::Scaler::SerializeWithCachedSizes(Scaler *this,CodedOutputStream *output)

{
  Rep *pRVar1;
  double *pdVar2;
  
  if (0 < (this->shiftvalue_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,10);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_shiftvalue_cached_byte_size_);
    pRVar1 = (this->shiftvalue_).rep_;
    pdVar2 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      pdVar2 = (double *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteDoubleArray
              (pdVar2,(this->shiftvalue_).current_size_,output);
  }
  if (0 < (this->scalevalue_).current_size_) {
    google::protobuf::io::CodedOutputStream::WriteVarint32(output,0x12);
    google::protobuf::io::CodedOutputStream::WriteVarint32
              (output,this->_scalevalue_cached_byte_size_);
    pRVar1 = (this->scalevalue_).rep_;
    pdVar2 = pRVar1->elements;
    if (pRVar1 == (Rep *)0x0) {
      pdVar2 = (double *)0x0;
    }
    google::protobuf::internal::WireFormatLite::WriteDoubleArray
              (pdVar2,(this->scalevalue_).current_size_,output);
    return;
  }
  return;
}

Assistant:

void Scaler::SerializeWithCachedSizes(
    ::google::protobuf::io::CodedOutputStream* output) const {
  // @@protoc_insertion_point(serialize_start:CoreML.Specification.Scaler)
  ::google::protobuf::uint32 cached_has_bits = 0;
  (void) cached_has_bits;

  // repeated double shiftValue = 1;
  if (this->shiftvalue_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(1, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_shiftvalue_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->shiftvalue().data(), this->shiftvalue_size(), output);
  }

  // repeated double scaleValue = 2;
  if (this->scalevalue_size() > 0) {
    ::google::protobuf::internal::WireFormatLite::WriteTag(2, ::google::protobuf::internal::WireFormatLite::WIRETYPE_LENGTH_DELIMITED, output);
    output->WriteVarint32(_scalevalue_cached_byte_size_);
    ::google::protobuf::internal::WireFormatLite::WriteDoubleArray(
      this->scalevalue().data(), this->scalevalue_size(), output);
  }

  // @@protoc_insertion_point(serialize_end:CoreML.Specification.Scaler)
}